

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testInit(GLSLContantImmutablityTest *this)

{
  pointer *pptVar1;
  iterator __position;
  testCase tVar2;
  GLuint constant;
  CONSTANTS CVar3;
  GLuint stage;
  STAGES SVar4;
  testCase test_case;
  testCase local_30;
  
  CVar3 = GL_ARB_ENHANCED_LAYOUTS;
  do {
    SVar4 = COMPUTE;
    do {
      __position._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_30.m_constant = CVar3;
        local_30.m_stage = SVar4;
        std::
        vector<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase,std::allocator<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase>>
        ::_M_realloc_insert<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase_const&>
                  ((vector<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase,std::allocator<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase>>
                    *)&this->m_test_cases,__position,&local_30);
      }
      else {
        tVar2.m_stage = SVar4;
        tVar2.m_constant = CVar3;
        *__position._M_current = tVar2;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      SVar4 = SVar4 + VERTEX;
    } while (SVar4 != STAGE_MAX);
    CVar3 = CVar3 + GL_MAX_XFB;
  } while (CVar3 != CONSTANTS_MAX);
  return;
}

Assistant:

void GLSLContantImmutablityTest::testInit()
{
	for (GLuint constant = 0; constant < CONSTANTS_MAX; ++constant)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			testCase test_case = { (CONSTANTS)constant, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}